

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
          (cmGeneratorTarget *this,string *p,string *config)

{
  TargetType TVar1;
  CompatibleInterfacesBase *pCVar2;
  size_type sVar3;
  bool bVar4;
  
  TVar1 = this->Target->TargetTypeValue;
  bVar4 = false;
  if ((TVar1 != OBJECT_LIBRARY) && (bVar4 = false, TVar1 != INTERFACE_LIBRARY)) {
    pCVar2 = GetCompatibleInterfaces(this,config);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&pCVar2->PropsNumberMax,p);
    bVar4 = sVar3 != 0;
  }
  return bVar4;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}